

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

void __thiscall soplex::SPxSolverBase<double>::calculateProblemRanges(SPxSolverBase<double> *this)

{
  double dVar1;
  long lVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  
  ::soplex::infinity::__tls_init();
  ::soplex::infinity::__tls_init();
  ::soplex::infinity::__tls_init();
  dVar1 = *(double *)(in_FS_OFFSET + -8);
  local_48 = 0.0;
  local_58 = 0.0;
  local_80 = 0.0;
  local_88 = dVar1;
  local_68 = dVar1;
  if (0 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    local_80 = 0.0;
    lVar2 = 0;
    local_58 = 0.0;
    do {
      dVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar2];
      dVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar2];
      ::soplex::infinity::__tls_init();
      dVar3 = ABS(dVar3);
      if (dVar3 < dVar1) {
        if (dVar3 <= local_68) {
          local_68 = dVar3;
        }
        if (local_58 <= dVar3) {
          local_58 = dVar3;
        }
      }
      ::soplex::infinity::__tls_init();
      if (dVar3 < dVar1) {
        if (dVar3 <= local_68) {
          local_68 = dVar3;
        }
        if (local_58 <= dVar3) {
          local_58 = dVar3;
        }
      }
      dVar4 = ABS(dVar4);
      if (dVar4 <= local_88) {
        local_88 = dVar4;
      }
      if (local_80 <= dVar4) {
        local_80 = dVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  local_78 = dVar1;
  if (0 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum) {
    local_48 = 0.0;
    lVar2 = 0;
    do {
      dVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar2];
      dVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar2];
      ::soplex::infinity::__tls_init();
      dVar3 = ABS(dVar3);
      if (dVar1 < dVar3) {
        if (dVar3 <= local_78) {
          local_78 = dVar3;
        }
        if (local_48 <= dVar3) {
          local_48 = dVar3;
        }
      }
      ::soplex::infinity::__tls_init();
      dVar4 = ABS(dVar4);
      if (dVar4 < dVar1) {
        if (dVar4 <= local_78) {
          local_78 = dVar4;
        }
        if (local_48 <= dVar4) {
          local_48 = dVar4;
        }
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
  }
  this->boundrange = local_58 - local_68;
  this->siderange = local_48 - local_78;
  this->objrange = local_80 - local_88;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}